

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O2

void __thiscall axl::cry::AppStoreReceipt::clear(AppStoreReceipt *this)

{
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(&this->m_bundleId);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(&this->m_appVersion);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(&this->m_originalAppVersion);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(&this->m_receiptCreationDateString)
  ;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear
            (&this->m_receiptExpirationDateString);
  this->m_receiptCreationTimestamp = 0;
  this->m_receiptExpirationTimestamp = 0;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear(&this->m_opaque);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear(&this->m_sha1Hash);
  return;
}

Assistant:

void
AppStoreReceipt::clear() {
	m_bundleId.clear();
	m_appVersion.clear();
	m_originalAppVersion.clear();
	m_receiptCreationDateString.clear();
	m_receiptExpirationDateString.clear();
	m_receiptCreationTimestamp = 0;
	m_receiptExpirationTimestamp = 0;
	m_opaque.clear();
	m_sha1Hash.clear();
}